

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O1

void __thiscall
QGraphicsSceneBspTreeIndex::itemChange
          (QGraphicsSceneBspTreeIndex *this,QGraphicsItem *item,GraphicsItemChange change,
          void *value)

{
  QGraphicsSceneBspTreeIndexPrivate *this_00;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  this_00 = *(QGraphicsSceneBspTreeIndexPrivate **)(this + 8);
  if (change == ItemParentChange) {
    QGraphicsSceneBspTreeIndexPrivate::invalidateSortCache(this_00);
    uVar1 = *(ulong *)&((item->d_ptr).d)->field_0x160;
    bVar5 = true;
    if ((uVar1 >> 0x25 & 1) == 0) {
      if (value == (void *)0x0) {
        bVar5 = false;
      }
      else {
        bVar5 = (*(ulong *)(*(long *)((long)value + 8) + 0x160) & 0x2000040000) != 0;
      }
    }
    uVar3 = 1;
    if (((uint)uVar1 >> 0x11 & 1) == 0) {
      uVar3 = (uint)(uVar1 >> 0x14) & 1;
    }
    if (value == (void *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar2 = *(ulong *)(*(long *)((long)value + 8) + 0x160);
      uVar4 = 1;
      if ((uVar2 & 0x8001000020000) == 0) {
        uVar4 = (uint)(uVar2 >> 0x14) & 1;
      }
    }
    if ((bVar5 != ((uVar1 & 0x2000040000) != 0)) || (uVar3 != uVar4)) {
LAB_00633ea0:
      QGraphicsSceneBspTreeIndexPrivate::removeItem(this_00,item,true,true);
      return;
    }
  }
  else {
    if (change == ItemZValueChange) {
      QGraphicsSceneBspTreeIndexPrivate::invalidateSortCache(this_00);
      return;
    }
    if (change == ItemFlagsChange) {
      uVar1 = *(ulong *)&((item->d_ptr).d)->field_0x160;
      if ((SUB41((*value & 0x20) >> 5,0) == ((uVar1 >> 0x25 & 1) == 0)) ||
         (((*value & 0x80010) != 0) == ((uVar1 & 0x8001000000000) == 0))) goto LAB_00633ea0;
    }
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndex::itemChange(const QGraphicsItem *item, QGraphicsItem::GraphicsItemChange change, const void *const value)
{
    Q_D(QGraphicsSceneBspTreeIndex);
    switch (change) {
    case QGraphicsItem::ItemFlagsChange: {
        // Handle ItemIgnoresTransformations
        QGraphicsItem::GraphicsItemFlags newFlags = *static_cast<const QGraphicsItem::GraphicsItemFlags *>(value);
        bool ignoredTransform = item->d_ptr->flags & QGraphicsItem::ItemIgnoresTransformations;
        bool willIgnoreTransform = newFlags & QGraphicsItem::ItemIgnoresTransformations;
        bool clipsChildren = item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                             || item->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape;
        bool willClipChildren = newFlags & QGraphicsItem::ItemClipsChildrenToShape
                                || newFlags & QGraphicsItem::ItemContainsChildrenInShape;
        if ((ignoredTransform != willIgnoreTransform) || (clipsChildren != willClipChildren)) {
            QGraphicsItem *thatItem = const_cast<QGraphicsItem *>(item);
            // Remove item and its descendants from the index and append
            // them to the list of unindexed items. Then, when the index
            // is updated, they will be put into the bsp-tree or the list
            // of untransformable items.
            d->removeItem(thatItem, /*recursive=*/true, /*moveToUnidexedItems=*/true);
        }
        break;
    }
    case QGraphicsItem::ItemZValueChange:
        d->invalidateSortCache();
        break;
    case QGraphicsItem::ItemParentChange: {
        d->invalidateSortCache();
        // Handle ItemIgnoresTransformations
        const QGraphicsItem *newParent = static_cast<const QGraphicsItem *>(value);
        bool ignoredTransform = item->d_ptr->itemIsUntransformable();
        bool willIgnoreTransform = (item->d_ptr->flags & QGraphicsItem::ItemIgnoresTransformations)
                                   || (newParent && newParent->d_ptr->itemIsUntransformable());
        bool ancestorClippedChildren = item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
                                       || item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren;
        bool ancestorWillClipChildren = newParent
                            && ((newParent->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape
                                 || newParent->d_ptr->flags & QGraphicsItem::ItemContainsChildrenInShape)
                                || (newParent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
                                    || newParent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren));
        if ((ignoredTransform != willIgnoreTransform) || (ancestorClippedChildren != ancestorWillClipChildren)) {
            QGraphicsItem *thatItem = const_cast<QGraphicsItem *>(item);
            // Remove item and its descendants from the index and append
            // them to the list of unindexed items. Then, when the index
            // is updated, they will be put into the bsp-tree or the list
            // of untransformable items.
            d->removeItem(thatItem, /*recursive=*/true, /*moveToUnidexedItems=*/true);
        }
        break;
    }
    default:
        break;
    }
}